

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_1.cpp
# Opt level: O3

int main(void)

{
  double *__last;
  double dVar1;
  bool bVar2;
  double __x;
  uint uVar3;
  ulong uVar4;
  double *pdVar5;
  ostream *poVar6;
  double *pdVar7;
  double *pdVar8;
  double *__i;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar13;
  double dVar14;
  int N;
  double da;
  uint local_4c;
  undefined1 local_48 [16];
  
  __isoc99_scanf("%d",&local_4c);
  uVar4 = (ulong)(int)local_4c;
  if (0 < (long)uVar4) {
    pdVar7 = num;
    lVar11 = 0;
    do {
      __isoc99_scanf("%lf",pdVar7);
      lVar11 = lVar11 + 1;
      uVar4 = (ulong)(int)local_4c;
      pdVar7 = pdVar7 + 1;
    } while (lVar11 < (long)uVar4);
  }
  uVar3 = local_4c;
  pdVar7 = num;
  if (local_4c != 0) {
    __last = num + uVar4;
    lVar11 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::__introsort_loop<double*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(double,double)>>
              (num,__last,(ulong)(((uint)lVar11 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(double,_double)>)0x1011cc);
    if ((int)uVar3 < 0x11) {
      if (uVar3 != 1) {
        pdVar10 = num + 1;
        pdVar8 = num;
        do {
          pdVar9 = pdVar10;
          dVar1 = num[0];
          dVar13 = pdVar8[1];
          dVar14 = round(dVar13);
          local_48._8_8_ = 0;
          local_48._0_8_ = ABS(dVar13 - dVar14);
          dVar14 = round(dVar1);
          bVar2 = dVar13 < dVar1;
          if (1e-06 <= ABS((double)local_48._0_8_ - ABS(dVar1 - dVar14))) {
            bVar2 = (double)local_48._0_8_ < ABS(dVar1 - dVar14);
          }
          if (bVar2) {
            memmove((void *)((long)pdVar8 + (0x10 - (long)(pdVar9 + -0x20810))),num,
                    (size_t)(pdVar9 + -0x20810));
            pdVar10 = num;
          }
          else {
            dVar14 = *pdVar8;
            dVar1 = round(dVar14);
            bVar2 = (double)local_48._0_8_ < ABS(dVar14 - dVar1);
            if (ABS((double)local_48._0_8_ - ABS(dVar14 - dVar1)) < 1e-06) {
              bVar2 = dVar13 < dVar14;
            }
            pdVar10 = pdVar9;
            if (bVar2) {
              do {
                *pdVar10 = dVar14;
                dVar14 = pdVar10[-2];
                dVar1 = round(dVar14);
                bVar2 = dVar13 < dVar14;
                if (1e-06 <= ABS((double)local_48._0_8_ - ABS(dVar14 - dVar1))) {
                  bVar2 = (double)local_48._0_8_ < ABS(dVar14 - dVar1);
                }
                pdVar10 = pdVar10 + -1;
              } while (bVar2);
            }
          }
          *pdVar10 = dVar13;
          pdVar10 = pdVar9 + 1;
          pdVar8 = pdVar9;
        } while (pdVar9 + 1 != __last);
      }
    }
    else {
      pdVar9 = num + 0x10;
      pdVar10 = num + 1;
      pdVar8 = num;
      do {
        pdVar5 = pdVar10;
        dVar1 = num[0];
        dVar13 = pdVar8[1];
        dVar14 = round(dVar13);
        local_48._8_8_ = 0;
        local_48._0_8_ = ABS(dVar13 - dVar14);
        dVar14 = round(dVar1);
        bVar2 = dVar13 < dVar1;
        if (1e-06 <= ABS((double)local_48._0_8_ - ABS(dVar1 - dVar14))) {
          bVar2 = (double)local_48._0_8_ < ABS(dVar1 - dVar14);
        }
        if (bVar2) {
          memmove((void *)((long)pdVar8 + (0x10 - (long)(pdVar5 + -0x20810))),num,
                  (size_t)(pdVar5 + -0x20810));
          pdVar10 = num;
        }
        else {
          dVar14 = *pdVar8;
          dVar1 = round(dVar14);
          bVar2 = (double)local_48._0_8_ < ABS(dVar14 - dVar1);
          if (ABS((double)local_48._0_8_ - ABS(dVar14 - dVar1)) < 1e-06) {
            bVar2 = dVar13 < dVar14;
          }
          pdVar10 = pdVar5;
          if (bVar2) {
            do {
              *pdVar10 = dVar14;
              dVar14 = pdVar10[-2];
              dVar1 = round(dVar14);
              bVar2 = dVar13 < dVar14;
              if (1e-06 <= ABS((double)local_48._0_8_ - ABS(dVar14 - dVar1))) {
                bVar2 = (double)local_48._0_8_ < ABS(dVar14 - dVar1);
              }
              pdVar10 = pdVar10 + -1;
            } while (bVar2);
          }
        }
        *pdVar10 = dVar13;
        pdVar10 = pdVar5 + 1;
        pdVar8 = pdVar5;
      } while (pdVar5 + 1 != num + 0x10);
      do {
        dVar13 = pdVar9[-1];
        __x = *pdVar9;
        dVar14 = round(dVar13);
        local_48._8_4_ = extraout_XMM0_Dc;
        local_48._0_8_ = dVar14;
        local_48._12_4_ = extraout_XMM0_Dd;
        dVar14 = round(__x);
        dVar1 = dVar13 - (double)local_48._0_8_;
        dVar14 = ABS(__x - dVar14);
        local_48._8_4_ = SUB84(dVar14,0);
        local_48._0_8_ = dVar14;
        local_48._12_4_ = (int)((ulong)dVar14 >> 0x20);
        bVar2 = __x < dVar13;
        if (1e-06 <= ABS(dVar14 - ABS(dVar1))) {
          bVar2 = dVar14 < ABS(dVar1);
        }
        pdVar10 = pdVar9;
        if (bVar2) {
          do {
            *pdVar10 = dVar13;
            dVar13 = pdVar10[-2];
            dVar14 = round(dVar13);
            bVar2 = __x < dVar13;
            if (1e-06 <= ABS((double)local_48._0_8_ - ABS(dVar13 - dVar14))) {
              bVar2 = (double)local_48._0_8_ < ABS(dVar13 - dVar14);
            }
            pdVar10 = pdVar10 + -1;
          } while (bVar2);
        }
        *pdVar10 = __x;
        pdVar9 = pdVar9 + 1;
      } while (pdVar9 != __last);
    }
  }
  uVar4 = (ulong)local_4c;
  if (0 < (int)local_4c) {
    uVar12 = 0;
    do {
      lVar11 = std::cout;
      if (uVar12 == (int)uVar4 - 1) {
        *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 6;
        std::ostream::_M_insert<double>(*pdVar7);
      }
      else {
        memmove[*(long *)(std::cout + -0x18)] =
             (code)((byte)memmove[*(long *)(std::cout + -0x18)] | 4);
        *(undefined8 *)(std::ios_base::Init::Init + *(long *)(lVar11 + -0x18)) = 6;
        poVar6 = std::ostream::_M_insert<double>(*pdVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      }
      uVar12 = uVar12 + 1;
      uVar4 = (ulong)(int)local_4c;
      pdVar7 = pdVar7 + 1;
    } while ((long)uVar12 < (long)uVar4);
  }
  return 0;
}

Assistant:

int main()
{
    int N;
    scanf("%d",&N);
    for (int i = 0; i < N; ++i) {
        scanf("%lf",&num[i]);

    }
    sort(num,num + N,cmp);
    for (int j = 0; j < N; ++j) {
        if(j != N - 1)
        {
            //printf("%.6lf ",num[j]);
            cout.setf(ios::fixed);          //fixed表示不带指数域，若要用指数域则使用scientific
            cout << setprecision(6) << num[j] << " ";
        }
        else
            //printf("%.6lf",num[j]);
            cout << setprecision(6) << num[j];
    }
    return 0;
}